

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System_test.cc
# Opt level: O2

void __thiscall
CounterSystem::update(CounterSystem *this,EntityManager *es,EventManager *events,TimeDelta param_3)

{
  Counter *pCVar1;
  Entity entity;
  Iterator __begin1;
  Handle counter;
  View<Counter> entities;
  Iterator __end1;
  Entity local_a0;
  ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false> local_90;
  ComponentHandle<Counter,_entityx::EntityManager> local_68;
  BaseView<false> local_50;
  Iterator local_40;
  
  local_50 = (BaseView<false>)entityx::EntityManager::entities_with_components<Counter>(es);
  local_68.manager_ = (EntityManager *)0x0;
  local_68.id_.id_ = 0;
  entityx::EntityManager::BaseView<false>::begin((Iterator *)&local_90,&local_50);
  entityx::EntityManager::BaseView<false>::end(&local_40,&local_50);
  while( true ) {
    if (local_90.i_ ==
        local_40.super_ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>.i_)
    break;
    local_a0.id_.id_ =
         CONCAT44(*(undefined4 *)(*(long *)(local_90.manager_ + 0x60) + (ulong)local_90.i_ * 4),
                  local_90.i_);
    local_a0.manager_ = local_90.manager_;
    entityx::Entity::unpack<Counter>(&local_a0,&local_68);
    pCVar1 = entityx::ComponentHandle<Counter,_entityx::EntityManager>::operator->(&local_68);
    pCVar1->counter = pCVar1->counter + 1;
    entityx::EntityManager::ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>::
    operator++(&local_90);
  }
  return;
}

Assistant:

void update(EntityManager &es, EventManager &events, TimeDelta) override {
    auto entities = es.entities_with_components<Counter>();
    Counter::Handle counter;
    for (auto entity : entities) {
      entity.unpack<Counter>(counter);
      counter->counter++;
    }
  }